

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportInstallFileGenerator::GenerateImportFileConfig
          (cmExportInstallFileGenerator *this,string *config)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  bool bVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string fileName;
  string se;
  cmGeneratedFileStream exportFileStream;
  ostringstream e;
  string local_470;
  string local_450;
  undefined1 **local_430;
  long local_428;
  undefined1 *local_420;
  undefined1 local_418 [32];
  undefined1 local_3f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  undefined1 *local_3d8;
  undefined8 local_3d0;
  size_type local_3c8;
  pointer local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined1 *local_3a8;
  undefined8 local_3a0;
  undefined1 local_190 [24];
  undefined1 local_178 [88];
  ios_base local_120 [264];
  
  bVar1 = cmInstallGenerator::InstallsForConfig(&this->IEGen->super_cmInstallGenerator,config);
  bVar4 = true;
  if (bVar1) {
    local_3f8._8_8_ = (this->super_cmExportFileGenerator).FileDir._M_dataplus._M_p;
    local_3f8._0_8_ = (this->super_cmExportFileGenerator).FileDir._M_string_length;
    local_3e8._M_allocated_capacity = 0;
    local_3d8 = local_178;
    local_190._0_8_ = (_func_int **)0x0;
    local_190._8_8_ = 1;
    local_178[0] = 0x2f;
    local_3e8._8_8_ = 1;
    local_3d0 = 0;
    local_3c0 = (this->super_cmExportFileGenerator).FileBase._M_dataplus._M_p;
    local_3c8 = (this->super_cmExportFileGenerator).FileBase._M_string_length;
    local_3b8 = 0;
    local_420 = local_418;
    local_430 = (undefined1 **)0x0;
    local_428 = 1;
    local_418[0] = 0x2d;
    local_3b0 = 1;
    local_3a0 = 0;
    views._M_len = 4;
    views._M_array = (iterator)local_3f8;
    local_3a8 = local_420;
    local_190._16_8_ = local_3d8;
    cmCatViews(&local_470,views);
    if (config->_M_string_length == 0) {
      std::__cxx11::string::append((char *)&local_470);
    }
    else {
      cmsys::SystemTools::LowerCase((string *)local_3f8,config);
      std::__cxx11::string::_M_append((char *)&local_470,local_3f8._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._0_8_ != &local_3e8) {
        operator_delete((void *)local_3f8._0_8_,(ulong)(local_3e8._M_allocated_capacity + 1));
      }
    }
    std::__cxx11::string::_M_append
              ((char *)&local_470,
               (ulong)(this->super_cmExportFileGenerator).FileExt._M_dataplus._M_p);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_3f8,&local_470,true,None);
    bVar4 = (*(byte *)((long)&local_3d8 + *(long *)(local_3f8._0_8_ + -0x18)) & 5) == 0;
    if (bVar4) {
      cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_3f8,true);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[4])(this,local_3f8,config);
      cmExportFileGenerator::GenerateImportConfig
                (&this->super_cmExportFileGenerator,(ostream *)local_3f8,config);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[5])(this,local_3f8);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->ConfigImportFiles,config);
      std::__cxx11::string::_M_assign((string *)pmVar3);
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"cannot write to file \"",0x16);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_190,local_470._M_dataplus._M_p,local_470._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\": ",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_430,local_428);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_450);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
      std::ios_base::~ios_base(local_120);
      if (local_430 != &local_420) {
        operator_delete(local_430,(ulong)(local_420 + 1));
      }
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_3f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar4;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateImportFileConfig(
  const std::string& config)
{
  // Skip configurations not enabled for this export.
  if (!this->IEGen->InstallsForConfig(config)) {
    return true;
  }

  // Construct the name of the file to generate.
  std::string fileName = cmStrCat(this->FileDir, '/', this->FileBase, '-');
  if (!config.empty()) {
    fileName += cmSystemTools::LowerCase(config);
  } else {
    fileName += "noconfig";
  }
  fileName += this->FileExt;

  // Open the output file to generate it.
  cmGeneratedFileStream exportFileStream(fileName, true);
  if (!exportFileStream) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  exportFileStream.SetCopyIfDifferent(true);
  std::ostream& os = exportFileStream;

  // Start with the import file header.
  this->GenerateImportHeaderCode(os, config);

  // Generate the per-config target information.
  this->GenerateImportConfig(os, config);

  // End with the import file footer.
  this->GenerateImportFooterCode(os);

  // Record this per-config import file.
  this->ConfigImportFiles[config] = fileName;

  return true;
}